

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O3

void __thiscall ImageList::ImageList(ImageList *this,QSize maxImageSize,QWidget *parent)

{
  ImageListPrivate *pIVar1;
  
  QtMWidgets::AbstractListView<QImage>::AbstractListView
            (&this->super_AbstractListView<QImage>,parent);
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea =
       &PTR_metaObject_001a0af8;
  *(undefined ***)
   &(this->super_AbstractListView<QImage>).super_AbstractListViewBase.super_AbstractScrollArea.
    field_0x10 = &PTR__ImageList_001a0d08;
  pIVar1 = (ImageListPrivate *)operator_new(0x18);
  pIVar1->q = this;
  pIVar1->borderWidth = 5;
  (pIVar1->maxImageSize).wd = maxImageSize.wd + -10;
  (pIVar1->maxImageSize).ht = maxImageSize.ht + -10;
  (this->d).d = pIVar1;
  QtMWidgets::AbstractListViewBase::setSpacing((AbstractListViewBase *)this,5);
  return;
}

Assistant:

ImageList::ImageList( const QSize maxImageSize, QWidget * parent )
	:	QtMWidgets::AbstractListView< QImage > ( parent )
	,	d( new ImageListPrivate( maxImageSize, this ) )
{
	d->init();
}